

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O0

void __thiscall
miniros::Publication::addCallbacks(Publication *this,SubscriberCallbacksPtr *callbacks)

{
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  __shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2> *in_RSI;
  shared_ptr<miniros::SubscriberLink> *in_RDI;
  CallbackInterfacePtr cb;
  SubscriberLinkPtr *sub_link;
  iterator end;
  iterator it;
  scoped_lock<std::mutex> lock_1;
  scoped_lock<std::mutex> lock;
  mutex_type *in_stack_ffffffffffffff58;
  function<void_(const_miniros::SingleSubscriberPublisher_&)> *in_stack_ffffffffffffff60;
  value_type *in_stack_ffffffffffffff68;
  CallbackQueueInterface *pCVar4;
  vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>
  *in_stack_ffffffffffffff70;
  undefined1 *puVar5;
  reference __args_3;
  bool *__args_2;
  undefined8 in_stack_ffffffffffffff98;
  undefined1 local_58 [16];
  reference local_48;
  shared_ptr<miniros::SubscriberLink> *local_40;
  __normal_iterator<std::shared_ptr<miniros::SubscriberLink>_*,_std::vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>_>
  local_38 [5];
  __shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2> *local_10;
  
  local_10 = in_RSI;
  std::scoped_lock<std::mutex>::scoped_lock
            ((scoped_lock<std::mutex> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
  std::
  vector<std::shared_ptr<miniros::SubscriberCallbacks>,_std::allocator<std::shared_ptr<miniros::SubscriberCallbacks>_>_>
  ::push_back(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  std::__shared_ptr_access<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              *)0x4887a0);
  bVar1 = std::function::operator_cast_to_bool(in_stack_ffffffffffffff60);
  if ((bVar1) &&
     (peVar2 = std::
               __shared_ptr_access<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x4887be), peVar2->callback_queue_ != (CallbackQueueInterface *)0x0))
  {
    std::scoped_lock<std::mutex>::scoped_lock
              ((scoped_lock<std::mutex> *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
    local_38[0]._M_current =
         (shared_ptr<miniros::SubscriberLink> *)
         std::
         vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
         ::begin((vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
                  *)in_stack_ffffffffffffff58);
    local_40 = (shared_ptr<miniros::SubscriberLink> *)
               std::
               vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
               ::end((vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
                      *)in_stack_ffffffffffffff58);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::shared_ptr<miniros::SubscriberLink>_*,_std::vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>_>
                               *)in_stack_ffffffffffffff60,
                              (__normal_iterator<std::shared_ptr<miniros::SubscriberLink>_*,_std::vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>_>
                               *)in_stack_ffffffffffffff58), bVar1) {
      local_48 = __gnu_cxx::
                 __normal_iterator<std::shared_ptr<miniros::SubscriberLink>_*,_std::vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>_>
                 ::operator*(local_38);
      std::
      __shared_ptr_access<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x488841);
      __args_3 = local_48;
      peVar2 = std::
               __shared_ptr_access<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x48885d);
      __args_2 = &peVar2->has_tracked_object_;
      std::
      __shared_ptr_access<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x488873);
      std::
      make_shared<miniros::PeerConnDisconnCallback,std::function<void(miniros::SingleSubscriberPublisher_const&)>&,std::shared_ptr<miniros::SubscriberLink>const&,bool&,std::weak_ptr<void_const>&>
                ((function<void_(const_miniros::SingleSubscriberPublisher_&)> *)
                 in_stack_ffffffffffffff98,in_RDI,__args_2,(weak_ptr<const_void> *)__args_3);
      puVar5 = local_58;
      in_stack_ffffffffffffff60 =
           (function<void_(const_miniros::SingleSubscriberPublisher_&)> *)&stack0xffffffffffffff98;
      std::shared_ptr<miniros::CallbackInterface>::shared_ptr<miniros::PeerConnDisconnCallback,void>
                ((shared_ptr<miniros::CallbackInterface> *)in_stack_ffffffffffffff60,
                 (shared_ptr<miniros::PeerConnDisconnCallback> *)in_stack_ffffffffffffff58);
      std::shared_ptr<miniros::PeerConnDisconnCallback>::~shared_ptr
                ((shared_ptr<miniros::PeerConnDisconnCallback> *)0x4888b8);
      peVar2 = std::
               __shared_ptr_access<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x4888c5);
      pCVar4 = peVar2->callback_queue_;
      peVar3 = std::__shared_ptr<miniros::SubscriberCallbacks,_(__gnu_cxx::_Lock_policy)2>::get
                         (local_10);
      (*pCVar4->_vptr_CallbackQueueInterface[2])(pCVar4,puVar5,peVar3);
      std::shared_ptr<miniros::CallbackInterface>::~shared_ptr
                ((shared_ptr<miniros::CallbackInterface> *)0x4888fd);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<miniros::SubscriberLink>_*,_std::vector<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>_>
      ::operator++(local_38);
    }
    std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x488962);
  }
  std::scoped_lock<std::mutex>::~scoped_lock((scoped_lock<std::mutex> *)0x48897d);
  return;
}

Assistant:

void Publication::addCallbacks(const SubscriberCallbacksPtr& callbacks)
{
  std::scoped_lock<std::mutex> lock(callbacks_mutex_);

  callbacks_.push_back(callbacks);

  // Add connect callbacks for all current subscriptions if this publisher wants them
  if (callbacks->connect_ && callbacks->callback_queue_)
  {
    std::scoped_lock<std::mutex> lock(subscriber_links_mutex_);
    V_SubscriberLink::iterator it = subscriber_links_.begin();
    V_SubscriberLink::iterator end = subscriber_links_.end();
    for (; it != end; ++it)
    {
      const SubscriberLinkPtr& sub_link = *it;
      CallbackInterfacePtr cb(std::make_shared<PeerConnDisconnCallback>(callbacks->connect_, sub_link, callbacks->has_tracked_object_, callbacks->tracked_object_));
      callbacks->callback_queue_->addCallback(cb, (uint64_t)callbacks.get());
    }
  }
}